

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::AssertionStats::~AssertionStats(AssertionStats *this)

{
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_0017eef0;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->infoMessages);
  AssertionResultData::~AssertionResultData(&(this->assertionResult).m_resultData);
  return;
}

Assistant:

AssertionStats::~AssertionStats() = default;